

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLDConfigLDConfigTool.cxx
# Opt level: O2

bool __thiscall
cmLDConfigLDConfigTool::GetLDConfigPaths
          (cmLDConfigLDConfigTool *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  cmRuntimeDependencyArchive *pcVar1;
  bool bVar2;
  int iVar3;
  cmMakefile *this_00;
  string *psVar4;
  cmUVProcessChainBuilder *this_01;
  istream *piVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view arg;
  allocator_type local_199;
  cmUVProcessChain process;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ldConfigCommand;
  string line;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> status
  ;
  string ldConfigPath;
  cmUVProcessChainBuilder builder;
  RegularExpressionMatch match;
  
  this_00 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmLDConfigTool).Archive);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&match,"CMAKE_LDCONFIG_COMMAND",(allocator<char> *)&builder);
  psVar4 = cmMakefile::GetSafeDefinition(this_00,(string *)&match);
  std::__cxx11::string::string((string *)&ldConfigPath,(string *)psVar4);
  std::__cxx11::string::~string((string *)&match);
  if (ldConfigPath._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&match,"/sbin",(allocator<char> *)&status);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(match.startp + 4),"/usr/sbin",(allocator<char> *)&ldConfigCommand);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(match.startp + 8),"/usr/local/sbin",(allocator<char> *)&process);
    __l._M_len = 3;
    __l._M_array = (iterator)&match;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&line,__l,&local_199);
    cmsys::SystemTools::FindProgram
              ((string *)&builder,"ldconfig",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&line,false);
    std::__cxx11::string::operator=((string *)&ldConfigPath,(string *)&builder);
    std::__cxx11::string::~string((string *)&builder);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&line);
    lVar6 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)match.startp + lVar6));
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != -0x20);
    if (ldConfigPath._M_string_length == 0) {
      pcVar1 = (this->super_cmLDConfigTool).Archive;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&match,"Could not find ldconfig",(allocator<char> *)&builder);
      cmRuntimeDependencyArchive::SetError(pcVar1,(string *)&match);
      std::__cxx11::string::~string((string *)&match);
      bVar2 = false;
      goto LAB_0047b210;
    }
  }
  arg._M_str = ldConfigPath._M_dataplus._M_p;
  arg._M_len = ldConfigPath._M_string_length;
  cmExpandedList_abi_cxx11_(&ldConfigCommand,arg,false);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ldConfigCommand,
             (char (*) [3])"-v");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ldConfigCommand,
             (char (*) [3])"-N");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ldConfigCommand,
             (char (*) [3])"-X");
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
  this_01 = cmUVProcessChainBuilder::SetBuiltinStream(&builder,Stream_OUTPUT);
  cmUVProcessChainBuilder::AddCommand(this_01,&ldConfigCommand);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&process);
  bVar2 = cmUVProcessChain::Valid(&process);
  if (bVar2) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    if (GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::
        regex == '\0') {
      iVar3 = __cxa_guard_acquire(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                   ::regex);
      if (iVar3 != 0) {
        cmsys::RegularExpression::RegularExpression(&GetLDConfigPaths::regex,"^([^\t:]*):");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetLDConfigPaths::regex,
                     &__dso_handle);
        __cxa_guard_release(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::regex);
      }
    }
    while( true ) {
      piVar5 = cmUVProcessChain::OutputStream(&process);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (piVar5,(string *)&line);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      memset(&match,0,0xa8);
      bVar2 = cmsys::RegularExpression::find(&GetLDConfigPaths::regex,line._M_dataplus._M_p,&match);
      if (bVar2) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&status,&match,1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)paths,
                   (string *)&status);
        std::__cxx11::string::~string((string *)&status);
      }
    }
    bVar2 = cmUVProcessChain::Wait(&process,-1);
    if (bVar2) {
      cmUVProcessChain::GetStatus(&status,&process);
      if ((*status.
            super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
            ._M_impl.super__Vector_impl_data._M_start == (Status *)0x0) ||
         ((*status.
            super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
            ._M_impl.super__Vector_impl_data._M_start)->ExitStatus != 0)) {
        pcVar1 = (this->super_cmLDConfigTool).Archive;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&match,"Failed to run ldconfig",(allocator<char> *)&local_199);
        cmRuntimeDependencyArchive::SetError(pcVar1,(string *)&match);
        std::__cxx11::string::~string((string *)&match);
        bVar2 = false;
      }
      else {
        bVar2 = true;
      }
      std::
      _Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
      ::~_Vector_base(&status.
                       super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                     );
    }
    else {
      pcVar1 = (this->super_cmLDConfigTool).Archive;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&match,"Failed to wait on ldconfig process",(allocator<char> *)&status);
      cmRuntimeDependencyArchive::SetError(pcVar1,(string *)&match);
      std::__cxx11::string::~string((string *)&match);
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&line);
  }
  else {
    pcVar1 = (this->super_cmLDConfigTool).Archive;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&match,"Failed to start ldconfig process",(allocator<char> *)&line);
    cmRuntimeDependencyArchive::SetError(pcVar1,(string *)&match);
    std::__cxx11::string::~string((string *)&match);
    bVar2 = false;
  }
  cmUVProcessChain::~cmUVProcessChain(&process);
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&builder.Processes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ldConfigCommand);
LAB_0047b210:
  std::__cxx11::string::~string((string *)&ldConfigPath);
  return bVar2;
}

Assistant:

bool cmLDConfigLDConfigTool::GetLDConfigPaths(std::vector<std::string>& paths)
{
  std::string ldConfigPath =
    this->Archive->GetMakefile()->GetSafeDefinition("CMAKE_LDCONFIG_COMMAND");
  if (ldConfigPath.empty()) {
    ldConfigPath = cmSystemTools::FindProgram(
      "ldconfig", { "/sbin", "/usr/sbin", "/usr/local/sbin" });
    if (ldConfigPath.empty()) {
      this->Archive->SetError("Could not find ldconfig");
      return false;
    }
  }

  std::vector<std::string> ldConfigCommand = cmExpandedList(ldConfigPath);
  ldConfigCommand.emplace_back("-v");
  ldConfigCommand.emplace_back("-N"); // Don't rebuild the cache.
  ldConfigCommand.emplace_back("-X"); // Don't update links.

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(ldConfigCommand);
  auto process = builder.Start();
  if (!process.Valid()) {
    this->Archive->SetError("Failed to start ldconfig process");
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression regex("^([^\t:]*):");
  while (std::getline(*process.OutputStream(), line)) {
    cmsys::RegularExpressionMatch match;
    if (regex.find(line.c_str(), match)) {
      paths.push_back(match.match(1));
    }
  }

  if (!process.Wait()) {
    this->Archive->SetError("Failed to wait on ldconfig process");
    return false;
  }
  auto status = process.GetStatus();
  if (!status[0] || status[0]->ExitStatus != 0) {
    this->Archive->SetError("Failed to run ldconfig");
    return false;
  }

  return true;
}